

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zopflipng_lib.cc
# Opt level: O2

int CZopfliPNGOptimize(uchar *origpng,size_t origpng_size,CZopfliPNGOptions *png_options,int verbose
                      ,uchar **resultpng,size_t *resultpng_size)

{
  pointer __src;
  int iVar1;
  uchar *__dest;
  int i;
  long lVar2;
  long lVar3;
  size_t __size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> resultpng_cc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> origpng_cc;
  undefined1 local_80 [40];
  pointer local_58;
  pointer pbStack_50;
  pointer local_48;
  bool local_40;
  undefined8 local_3c;
  int local_34;
  
  lVar3 = 0;
  local_80[0] = false;
  local_80._8_8_ = (pointer)0x0;
  local_80._16_8_ = (pointer)0x0;
  local_80._24_8_ = (pointer)0x0;
  local_80[0x21] = false;
  local_48 = (pointer)0x0;
  local_58 = (pointer)0x0;
  pbStack_50 = (pointer)0x0;
  local_80[1] = png_options->lossy_transparent != 0;
  local_80[2] = png_options->lossy_8bit != 0;
  local_80[0x20] = png_options->auto_filter_strategy != 0;
  local_40 = png_options->use_zopfli != 0;
  local_3c._0_4_ = png_options->num_iterations;
  local_3c._4_4_ = png_options->num_iterations_large;
  local_34 = png_options->block_split_strategy;
  for (lVar2 = 0; lVar2 < png_options->num_filter_strategies; lVar2 = lVar2 + 1) {
    std::vector<ZopfliPNGFilterStrategy,_std::allocator<ZopfliPNGFilterStrategy>_>::push_back
              ((vector<ZopfliPNGFilterStrategy,_std::allocator<ZopfliPNGFilterStrategy>_> *)
               (local_80 + 8),(value_type *)((long)png_options->filter_strategies + lVar3));
    lVar3 = lVar3 + 4;
  }
  for (lVar2 = 0; lVar2 < png_options->num_keepchunks; lVar2 = lVar2 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&origpng_cc,png_options->keepchunks[lVar2],(allocator<char> *)&resultpng_cc
              );
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&origpng_cc);
    std::__cxx11::string::~string((string *)&origpng_cc);
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&origpng_cc,origpng,
             origpng + origpng_size,(allocator_type *)&resultpng_cc);
  resultpng_cc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  resultpng_cc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  resultpng_cc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar1 = ZopfliPNGOptimize(&origpng_cc,(ZopfliPNGOptions *)local_80,verbose != 0,&resultpng_cc);
  __src = resultpng_cc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start;
  if (iVar1 == 0) {
    __size = (long)resultpng_cc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)resultpng_cc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    *resultpng_size = __size;
    __dest = (uchar *)malloc(__size);
    *resultpng = __dest;
    if (__dest == (uchar *)0x0) {
      iVar1 = 0xc;
    }
    else {
      memcpy(__dest,__src,__size);
      iVar1 = 0;
    }
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&resultpng_cc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&origpng_cc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  ZopfliPNGOptions::~ZopfliPNGOptions((ZopfliPNGOptions *)local_80);
  return iVar1;
}

Assistant:

int CZopfliPNGOptimize(const unsigned char* origpng,
                                  const size_t origpng_size,
                                  const CZopfliPNGOptions* png_options,
                                  int verbose,
                                  unsigned char** resultpng,
                                  size_t* resultpng_size) {
  ZopfliPNGOptions opts;

  // Copy over to the C++-style struct
  opts.lossy_transparent    = !!png_options->lossy_transparent;
  opts.lossy_8bit           = !!png_options->lossy_8bit;
  opts.auto_filter_strategy = !!png_options->auto_filter_strategy;
  opts.use_zopfli           = !!png_options->use_zopfli;
  opts.num_iterations       = png_options->num_iterations;
  opts.num_iterations_large = png_options->num_iterations_large;
  opts.block_split_strategy = png_options->block_split_strategy;

  for (int i = 0; i < png_options->num_filter_strategies; i++) {
    opts.filter_strategies.push_back(png_options->filter_strategies[i]);
  }

  for (int i = 0; i < png_options->num_keepchunks; i++) {
    opts.keepchunks.push_back(png_options->keepchunks[i]);
  }

  const std::vector<unsigned char> origpng_cc(origpng, origpng + origpng_size);
  std::vector<unsigned char> resultpng_cc;

  int ret = ZopfliPNGOptimize(origpng_cc, opts, !!verbose, &resultpng_cc);
  if (ret) {
    return ret;
  }

  *resultpng_size = resultpng_cc.size();
  *resultpng      = (unsigned char*) malloc(resultpng_cc.size());
  if (!(*resultpng)) {
    return ENOMEM;
  }

  memcpy(*resultpng,
         reinterpret_cast<unsigned char*>(&resultpng_cc[0]),
         resultpng_cc.size());

  return 0;
}